

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.cpp
# Opt level: O0

void __thiscall Graph::addEdge(Graph *this,int i,int j)

{
  bool bVar1;
  reference pvVar2;
  reference local_38;
  reference local_28;
  int local_18;
  int local_14;
  int j_local;
  int i_local;
  Graph *this_local;
  
  bVar1 = false;
  if (((-1 < i) && (bVar1 = false, i < this->r)) && (bVar1 = false, 0 < j)) {
    bVar1 = j < this->r;
  }
  local_18 = j;
  local_14 = i;
  _j_local = this;
  if (!bVar1) {
    __assert_fail("i >= 0 && i < r && j > 0 && j < r",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/leannejdong[P]circuitdebug/algorithm.cpp"
                  ,0x26,"void Graph::addEdge(int, int)");
  }
  pvVar2 = std::
           vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
           ::operator[](&this->adjMatrix,(long)i);
  local_28 = std::vector<bool,_std::allocator<bool>_>::operator[](pvVar2,(long)local_18);
  std::_Bit_reference::operator=(&local_28,true);
  pvVar2 = std::
           vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
           ::operator[](&this->adjMatrix,(long)local_18);
  local_38 = std::vector<bool,_std::allocator<bool>_>::operator[](pvVar2,(long)local_14);
  std::_Bit_reference::operator=(&local_38,true);
  return;
}

Assistant:

void addEdge(int i, int j) {
        assert(i >= 0 && i < r && j > 0 && j < r);
        adjMatrix[i][j] = true;
        adjMatrix[j][i] = true;
    }